

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlink.c
# Opt level: O0

xlinkType xlinkIsLink(xmlDocPtr doc,xmlNodePtr node)

{
  int iVar1;
  xmlChar *str1;
  xmlChar local_108 [8];
  xmlChar buf [200];
  xmlNsPtr xlink;
  xmlChar *pxStack_30;
  xlinkType ret;
  xmlChar *role;
  xmlChar *type;
  xmlNodePtr node_local;
  xmlDocPtr doc_local;
  
  pxStack_30 = (xmlChar *)0x0;
  xlink._4_4_ = XLINK_TYPE_NONE;
  if (node == (xmlNodePtr)0x0) {
    doc_local._4_4_ = XLINK_TYPE_NONE;
  }
  else {
    node_local = (xmlNodePtr)doc;
    if (doc == (xmlDocPtr)0x0) {
      node_local = (xmlNodePtr)node->doc;
    }
    if (((node_local == (xmlNodePtr)0x0) || (node_local->type != XML_HTML_DOCUMENT_NODE)) &&
       (node->ns != (xmlNs *)0x0)) {
      xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/1999/xhtml/");
    }
    str1 = xmlGetNsProp(node,"type",(xmlChar *)"http://www.w3.org/1999/xlink/namespace/");
    if (str1 != (xmlChar *)0x0) {
      iVar1 = xmlStrEqual(str1,"simple");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(str1,(xmlChar *)"extended");
        if (iVar1 != 0) {
          pxStack_30 = xmlGetNsProp(node,(xmlChar *)"role",
                                    (xmlChar *)"http://www.w3.org/1999/xlink/namespace/");
          if (pxStack_30 != (xmlChar *)0x0) {
            buf._192_8_ = xmlSearchNs((xmlDocPtr)node_local,node,
                                      (xmlChar *)"http://www.w3.org/1999/xlink/namespace/");
            if ((xmlNsPtr)buf._192_8_ == (xmlNsPtr)0x0) {
              xmlStrEqual(pxStack_30,(xmlChar *)"xlink:external-linkset");
            }
            else {
              snprintf((char *)local_108,200,"%s:external-linkset",((xmlNsPtr)buf._192_8_)->prefix);
              buf[0xbf] = '\0';
              xmlStrEqual(pxStack_30,local_108);
            }
          }
          xlink._4_4_ = XLINK_TYPE_EXTENDED;
        }
      }
      else {
        xlink._4_4_ = XLINK_TYPE_SIMPLE;
      }
    }
    if (str1 != (xmlChar *)0x0) {
      (*xmlFree)(str1);
    }
    if (pxStack_30 != (xmlChar *)0x0) {
      (*xmlFree)(pxStack_30);
    }
    doc_local._4_4_ = xlink._4_4_;
  }
  return doc_local._4_4_;
}

Assistant:

xlinkType
xlinkIsLink	(xmlDocPtr doc, xmlNodePtr node) {
    xmlChar *type = NULL, *role = NULL;
    xlinkType ret = XLINK_TYPE_NONE;

    if (node == NULL) return(XLINK_TYPE_NONE);
    if (doc == NULL) doc = node->doc;
    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        /*
	 * This is an HTML document.
	 */
    } else if ((node->ns != NULL) &&
               (xmlStrEqual(node->ns->href, XHTML_NAMESPACE))) {
	/*
	 * !!!! We really need an IS_XHTML_ELEMENT function from HTMLtree.h @@@
	 */
        /*
	 * This is an XHTML element within an XML document
	 * Check whether it's one of the element able to carry links
	 * and in that case if it holds the attributes.
	 */
    }

    /*
     * We don't prevent a-priori having XML Linking constructs on
     * XHTML elements
     */
    type = xmlGetNsProp(node, BAD_CAST"type", XLINK_NAMESPACE);
    if (type != NULL) {
	if (xmlStrEqual(type, BAD_CAST "simple")) {
            ret = XLINK_TYPE_SIMPLE;
	} else if (xmlStrEqual(type, BAD_CAST "extended")) {
	    role = xmlGetNsProp(node, BAD_CAST "role", XLINK_NAMESPACE);
	    if (role != NULL) {
		xmlNsPtr xlink;
		xlink = xmlSearchNs(doc, node, XLINK_NAMESPACE);
		if (xlink == NULL) {
		    /* Humm, fallback method */
		    if (xmlStrEqual(role, BAD_CAST"xlink:external-linkset"))
			ret = XLINK_TYPE_EXTENDED_SET;
		} else {
		    xmlChar buf[200];
		    snprintf((char *) buf, sizeof(buf), "%s:external-linkset",
			     (char *) xlink->prefix);
                    buf[sizeof(buf) - 1] = 0;
		    if (xmlStrEqual(role, buf))
			ret = XLINK_TYPE_EXTENDED_SET;

		}

	    }
	    ret = XLINK_TYPE_EXTENDED;
	}
    }

    if (type != NULL) xmlFree(type);
    if (role != NULL) xmlFree(role);
    return(ret);
}